

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

string * __thiscall
cppgenerate::Class::getFullyQualifiedName_abi_cxx11_(string *__return_storage_ptr__,Class *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (1 < (this->m_namespace)._M_string_length) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(this->m_namespace)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->m_className)._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string Class::getFullyQualifiedName() const{
    std::string ret;

    if( m_namespace.size() > 1 ){
        ret += m_namespace;
        ret += "::";
    }
    ret += m_className;

    return ret;
}